

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader15.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::LibraryControllersLoader15::begin__morph(LibraryControllersLoader15 *this)

{
  morph__AttributeData *in_stack_00000118;
  LibraryControllersLoader15 *in_stack_00000120;
  
  begin__morph(in_stack_00000120,in_stack_00000118);
  return;
}

Assistant:

bool LibraryControllersLoader15::begin__morph( const COLLADASaxFWL15::morph__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__morph(attributeData));
COLLADASaxFWL::morph__AttributeData attrData;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::morph__AttributeData::ATTRIBUTE_SOURCE_PRESENT) == COLLADASaxFWL15::morph__AttributeData::ATTRIBUTE_SOURCE_PRESENT ) {
    attrData.source = attributeData.source;
    attrData.present_attributes |= COLLADASaxFWL::morph__AttributeData::ATTRIBUTE_SOURCE_PRESENT;
}
switch (attributeData.method) {
case COLLADASaxFWL15::ENUM__morph_method_enum__NORMALIZED: attrData.method=COLLADASaxFWL::ENUM__MorphMethodType__NORMALIZED; break;
case COLLADASaxFWL15::ENUM__morph_method_enum__RELATIVE: attrData.method=COLLADASaxFWL::ENUM__MorphMethodType__RELATIVE; break;
case COLLADASaxFWL15::ENUM__morph_method_enum__COUNT: attrData.method=COLLADASaxFWL::ENUM__MorphMethodType__INVLAID; break;
case COLLADASaxFWL15::ENUM__morph_method_enum__NOT_PRESENT: attrData.method=COLLADASaxFWL::ENUM__MorphMethodType__NOT_PRESENT; break;
}
return mLoader->begin__morph(attrData);
}